

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase *
MatchGenericType(ExpressionContext *ctx,SynBase *source,TypeBase *matchType,TypeBase *argType,
                IntrusiveList<MatchData> *aliases,bool strict)

{
  long lVar1;
  longlong length;
  SynIdentifier *pSVar2;
  IntrusiveList<TypeHandle> arguments;
  uint uVar3;
  int iVar4;
  TypeBase *pTVar5;
  TypeBase *pTVar6;
  undefined4 extraout_var;
  TypeFunction *pTVar7;
  TypeArray *pTVar8;
  TypeRef *pTVar9;
  TypeUnsizedArray *pTVar10;
  MatchData *pMVar11;
  TypeArray *rhs;
  TypeGenericClassProto *lhs;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  IntrusiveList<MatchData> subAliases;
  IntrusiveList<MatchData> local_58;
  TypeBase *local_40;
  IntrusiveList<MatchData> *local_38;
  TypeHandle *node;
  undefined4 extraout_var_00;
  
  if (matchType->isGeneric == false) {
    if (argType->isGeneric == true) {
      local_58.head = (MatchData *)0x0;
      local_58.tail = (MatchData *)0x0;
      pTVar5 = MatchGenericType(ctx,source,argType,matchType,&local_58,true);
      if (pTVar5 != (TypeBase *)0x0) {
        argType = pTVar5;
      }
    }
    pTVar6 = (TypeBase *)0x0;
    pTVar5 = argType;
    if (!strict) {
      pTVar6 = matchType;
    }
LAB_0015d868:
    if (pTVar5 != matchType) {
      argType = pTVar6;
    }
  }
  else {
    switch(matchType->typeID) {
    case 0xc:
      if (!strict) {
        if (argType == (TypeBase *)0x0) break;
        uVar3 = argType->typeID;
        if (uVar3 != 0x13) goto LAB_0015d821;
        argType = (TypeBase *)
                  ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)argType[1]._vptr_TypeBase);
      }
      if ((TypeUnsizedArray *)argType != (TypeUnsizedArray *)0x0) {
        uVar3 = (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID;
LAB_0015d821:
        if (uVar3 == 0) {
          return (TypeBase *)0x0;
        }
        return (TypeBase *)(TypeUnsizedArray *)argType;
      }
      break;
    case 0xd:
      if (!strict) {
        if (argType == (TypeBase *)0x0) {
          argType = (TypeBase *)0x0;
        }
        else if (argType->typeID == 0x13) {
          argType = (TypeBase *)
                    ExpressionContext::GetUnsizedArrayType
                              (ctx,(TypeBase *)argType[1]._vptr_TypeBase);
        }
      }
      for (pMVar11 = aliases->head; pMVar11 != (MatchData *)0x0; pMVar11 = pMVar11->next) {
        bVar15 = InplaceStr::operator==
                           (&pMVar11->name->name,(InplaceStr *)(matchType[1]._vptr_TypeBase + 8));
        if (bVar15) {
          pTVar10 = (TypeUnsizedArray *)pMVar11->type;
          if (!strict) {
            return (TypeBase *)pTVar10;
          }
          if (pTVar10 == (TypeUnsizedArray *)argType) {
            return (TypeBase *)pTVar10;
          }
          return (TypeBase *)0x0;
        }
      }
      if ((((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
          (uVar3 = (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID,
          0x1c < uVar3)) || ((0x1c000001U >> (uVar3 & 0x1f) & 1) == 0)) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pMVar11 = (MatchData *)CONCAT44(extraout_var_00,iVar4);
        pSVar2 = (SynIdentifier *)matchType[1]._vptr_TypeBase;
        pMVar11->name = pSVar2;
        pMVar11->type = argType;
        pMVar11->next = (MatchData *)0x0;
        pMVar11->listed = false;
        if (pSVar2 == (SynIdentifier *)0x0) {
          __assert_fail("name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                        ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
        }
        IntrusiveList<MatchData>::push_back(aliases,pMVar11);
        return (TypeBase *)(TypeUnsizedArray *)argType;
      }
      break;
    default:
      anon_unknown.dwarf_c3752::Stop(ctx,source,"ERROR: unknown generic type match");
    case 0x12:
      if ((argType == (TypeBase *)0x0) || (argType->typeID != 0x12)) {
        if (strict) break;
        pTVar5 = (TypeBase *)matchType[1]._vptr_TypeBase;
      }
      else {
        pTVar5 = (TypeBase *)matchType[1]._vptr_TypeBase;
        argType = (TypeBase *)argType[1]._vptr_TypeBase;
      }
      pTVar5 = MatchGenericType(ctx,source,pTVar5,argType,aliases,true);
      if (pTVar5 != (TypeBase *)0x0) {
        pTVar9 = ExpressionContext::GetReferenceType(ctx,pTVar5);
        return &pTVar9->super_TypeBase;
      }
      break;
    case 0x13:
      if ((((argType != (TypeBase *)0x0) && (argType->typeID == 0x13)) &&
          (lVar14._0_4_ = matchType[1].typeID, lVar14._4_4_ = matchType[1].nameHash,
          lVar1._0_4_ = argType[1].typeID, lVar1._4_4_ = argType[1].nameHash, lVar14 == lVar1)) &&
         (pTVar5 = MatchGenericType(ctx,source,(TypeBase *)matchType[1]._vptr_TypeBase,
                                    (TypeBase *)argType[1]._vptr_TypeBase,aliases,true),
         pTVar5 != (TypeBase *)0x0)) {
        length._0_4_ = matchType[1].typeID;
        length._4_4_ = matchType[1].nameHash;
        pTVar8 = ExpressionContext::GetArrayType(ctx,pTVar5,length);
        return &pTVar8->super_TypeBase;
      }
      break;
    case 0x14:
      if (argType != (TypeBase *)0x0) {
        if (argType->typeID == 0x14) {
          pTVar5 = *(TypeBase **)&matchType[1].typeIndex;
          pTVar6 = *(TypeBase **)&argType[1].typeIndex;
        }
        else {
          if (argType->typeID != 0x13 || strict) break;
          pTVar5 = *(TypeBase **)&matchType[1].typeIndex;
          pTVar6 = (TypeBase *)argType[1]._vptr_TypeBase;
        }
        pTVar5 = MatchGenericType(ctx,source,pTVar5,pTVar6,aliases,true);
        if (pTVar5 != (TypeBase *)0x0) {
          pTVar10 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar5);
          return (TypeBase *)pTVar10;
        }
      }
      break;
    case 0x15:
      if (((argType != (TypeBase *)0x0) && (argType->typeID == 0x15)) &&
         (local_40 = MatchGenericType(ctx,source,(TypeBase *)matchType[1]._vptr_TypeBase,
                                      (TypeBase *)argType[1]._vptr_TypeBase,aliases,true),
         local_40 != (TypeBase *)0x0)) {
        local_58.head = (MatchData *)0x0;
        local_58.tail = (MatchData *)0x0;
        puVar12 = *(undefined8 **)&matchType[1].typeID;
        puVar13 = *(undefined8 **)&argType[1].typeID;
        bVar15 = puVar12 != (undefined8 *)0x0;
        bVar16 = puVar13 != (undefined8 *)0x0;
        local_38 = aliases;
        if (bVar15 && bVar16) {
          do {
            pTVar5 = MatchGenericType(ctx,source,(TypeBase *)*puVar12,(TypeBase *)*puVar13,local_38,
                                      true);
            if (pTVar5 == (TypeBase *)0x0) {
              return (TypeBase *)0x0;
            }
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
            node = (TypeHandle *)CONCAT44(extraout_var,iVar4);
            node->type = pTVar5;
            node->next = (TypeHandle *)0x0;
            node->listed = false;
            IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&local_58,node);
            puVar12 = (undefined8 *)puVar12[1];
            puVar13 = (undefined8 *)puVar13[1];
            bVar16 = puVar13 != (undefined8 *)0x0;
            bVar15 = puVar12 != (undefined8 *)0x0;
          } while ((bVar15) && (puVar13 != (undefined8 *)0x0));
        }
        if (!bVar15 && !bVar16) {
          arguments.tail = (TypeHandle *)local_58.tail;
          arguments.head = (TypeHandle *)local_58.head;
          pTVar7 = ExpressionContext::GetFunctionType(ctx,source,local_40,arguments);
          return &pTVar7->super_TypeBase;
        }
      }
      break;
    case 0x16:
      if ((argType != (TypeBase *)0x0) && (argType->typeID == 0x18)) {
        pTVar6 = (TypeBase *)0x0;
        pTVar5 = *(TypeBase **)&argType[2].typeIndex;
        goto LAB_0015d868;
      }
      break;
    case 0x17:
      if (((argType != (TypeBase *)0x0) && (argType->typeID == 0x18)) &&
         (matchType[1]._vptr_TypeBase == *(_func_int ***)&argType[2].typeIndex)) {
        lVar14 = argType[2].size;
        puVar12 = *(undefined8 **)&matchType[1].typeID;
        if (lVar14 == 0 || puVar12 == (undefined8 *)0x0) {
          return argType;
        }
        while (pTVar5 = MatchGenericType(ctx,source,(TypeBase *)*puVar12,*(TypeBase **)(lVar14 + 8),
                                         aliases,true), pTVar5 != (TypeBase *)0x0) {
          puVar12 = (undefined8 *)puVar12[1];
          if (puVar12 == (undefined8 *)0x0) {
            return argType;
          }
          lVar14 = *(long *)(lVar14 + 0x10);
          if (lVar14 == 0) {
            return argType;
          }
        }
      }
    }
    argType = (TypeBase *)0x0;
  }
  return argType;
}

Assistant:

TypeBase* MatchGenericType(ExpressionContext &ctx, SynBase *source, TypeBase *matchType, TypeBase *argType, IntrusiveList<MatchData> &aliases, bool strict)
{
	if(!matchType->isGeneric)
	{
		if(argType->isGeneric)
		{
			IntrusiveList<MatchData> subAliases;

			if(TypeBase *improved = MatchGenericType(ctx, source, argType, matchType, subAliases, true))
				argType = improved;
		}

		if(matchType == argType)
			return argType;

		if(strict)
			return NULL;

		return matchType;
	}

	// 'generic' match with 'type' results with 'type'
	if(isType<TypeGeneric>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		if(isType<TypeError>(argType))
			return NULL;

		return argType;
	}

	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
			{
				if(strict)
				{
					if(curr->type != argType)
						return NULL;
				}

				return curr->type;
			}
		}

		if(isType<TypeError>(argType))
			return NULL;

		if(isType<TypeArgumentSet>(argType) || isType<TypeMemberSet>(argType) || isType<TypeFunctionSet>(argType))
			return NULL;

		aliases.push_back(new (ctx.get<MatchData>()) MatchData(lhs->baseName, argType));

		return argType;
	}

	if(TypeRef *lhs = getType<TypeRef>(matchType))
	{
		// 'generic ref' match with 'type ref' results with 'type ref'
		if(TypeRef *rhs = getType<TypeRef>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetReferenceType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic ref' match with 'type' results with 'type ref'
		if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, argType, aliases, true))
			return ctx.GetReferenceType(match);

		return NULL;
	}

	if(TypeArray *lhs = getType<TypeArray>(matchType))
	{
		// Only match with arrays of the same size
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(lhs->length == rhs->length)
			{
				if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
					return ctx.GetArrayType(match, lhs->length);

				return NULL;
			}
		}

		return NULL;
	}

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(matchType))
	{
		// 'generic[]' match with 'type[]' results with 'type[]'
		if(TypeUnsizedArray *rhs = getType<TypeUnsizedArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic[]' match with 'type[N]' results with 'type[]'
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);
		}

		return NULL;
	}

	if(TypeFunction *lhs = getType<TypeFunction>(matchType))
	{
		// Only match with other function type
		if(TypeFunction *rhs = getType<TypeFunction>(argType))
		{
			TypeBase *returnType = MatchGenericType(ctx, source, lhs->returnType, rhs->returnType, aliases, true);

			if(!returnType)
				return NULL;

			IntrusiveList<TypeHandle> arguments;

			TypeHandle *lhsArg = lhs->arguments.head;
			TypeHandle *rhsArg = rhs->arguments.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argMatched));

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			// Different number of arguments
			if(lhsArg || rhsArg)
				return NULL;

			return ctx.GetFunctionType(source, returnType, arguments);
		}

		return NULL;
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs->proto != rhs->proto)
				return NULL;

			TypeHandle *lhsArg = lhs->generics.head;
			MatchData *rhsArg = rhs->generics.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			return argType;
		}

		return NULL;
	}

	if(TypeGenericClassProto *lhs = getType<TypeGenericClassProto>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs != rhs->proto)
				return NULL;

			return argType;
		}

		return NULL;
	}

	Stop(ctx, source, "ERROR: unknown generic type match");

	return NULL;
}